

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int Ssw_SmlNodeCountOnesReal(Ssw_Sml_t *p,Aig_Obj_t *pObj)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  uVar2 = p->nWordsTotal;
  lVar1 = (long)(int)(*(int *)(((ulong)pObj & 0xfffffffffffffffe) + 0x24) * uVar2) * 4;
  iVar4 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar5 = 0;
  if ((((uint)pObj ^ *(uint *)(((ulong)pObj & 0xfffffffffffffffe) + 0x18) >> 3) & 1) == 0) {
    for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = Aig_WordCountOnes(*(uint *)((long)&p[1].pAig + uVar5 * 4 + lVar1));
      iVar4 = iVar4 + iVar3;
    }
  }
  else {
    for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = Aig_WordCountOnes(~*(uint *)((long)&p[1].pAig + uVar5 * 4 + lVar1));
      iVar4 = iVar4 + iVar3;
    }
  }
  return iVar4;
}

Assistant:

int Ssw_SmlNodeCountOnesReal( Ssw_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i, Counter = 0;
    pSims = Ssw_ObjSim(p, Aig_Regular(pObj)->Id);
    if ( Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) )
    {
        for ( i = 0; i < p->nWordsTotal; i++ )
            Counter += Aig_WordCountOnes( ~pSims[i] );
    }
    else
    {
        for ( i = 0; i < p->nWordsTotal; i++ )
            Counter += Aig_WordCountOnes( pSims[i] );
    }
    return Counter;
}